

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  int iVar1;
  attr_counter *paVar2;
  attr_counter **ppaVar3;
  attr_counter *paVar4;
  attr_counter *paVar5;
  int iVar6;
  
  if (ac == (attr_counter *)0x0) {
    iVar6 = 0;
    if (last != (attr_counter *)0x0) {
      paVar4 = (attr_counter *)malloc(0x20);
      if (paVar4 == (attr_counter *)0x0) {
        iVar6 = -1;
      }
      else {
        paVar4->prev = last;
        paVar4->next = (attr_counter *)0x0;
        paVar4->count = 1;
        paVar4->m_entry = me;
        last->next = paVar4;
      }
    }
  }
  else {
    iVar1 = ac->count;
    ac->count = iVar1 + 1;
    iVar6 = 0;
    if ((*top != ac) && (paVar4 = ac->prev, paVar5 = paVar4, iVar6 = 0, paVar4->count <= iVar1)) {
      do {
        iVar6 = paVar5->count;
        if (iVar1 < iVar6) goto LAB_00199ed3;
        ppaVar3 = &paVar5->prev;
        paVar5 = *ppaVar3;
      } while (*ppaVar3 != (attr_counter *)0x0);
      paVar5 = (attr_counter *)0x0;
LAB_00199ed3:
      paVar2 = ac->next;
      paVar4->next = paVar2;
      if (paVar2 != (attr_counter *)0x0) {
        paVar2->prev = paVar4;
      }
      if (iVar1 < iVar6) {
        ac->prev = paVar5;
        ac->next = paVar5->next;
        paVar5->next = ac;
        iVar6 = 0;
        if (ac->next != (attr_counter *)0x0) {
          ac->next->prev = ac;
        }
      }
      else {
        ac->prev = (attr_counter *)0x0;
        ac->next = *top;
        *top = ac;
        ac->next->prev = ac;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else if (last != NULL) {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}